

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements
          (cmNinjaNormalTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *architectures,string *output)

{
  cmNinjaVars *this_00;
  pointer pbVar1;
  cmLocalNinjaGenerator *this_01;
  cmNinjaNormalTargetGenerator *this_02;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  cmGeneratedFileStream *pcVar5;
  pointer pbVar6;
  string_view source;
  string_view source_00;
  allocator<char> local_441;
  cmGlobalNinjaGenerator *local_440;
  string linkPath;
  cmNinjaNormalTargetGenerator *local_418;
  string frameworkPath;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string linkLibs;
  key_type local_348;
  string ninjaOutputDir;
  cmNinjaDeps explicitDeps;
  string objectDir;
  cmNinjaBuild dcompile;
  string local_1b0;
  string local_190;
  cmNinjaBuild fatbinary;
  string local_50;
  
  fatbinary.Comment._M_dataplus._M_p = (pointer)&fatbinary.Rule.field_2;
  fatbinary.Comment._M_string_length = 1;
  fatbinary.Comment.field_2._M_allocated_capacity = 0;
  fatbinary.Comment.field_2._8_8_ = 0;
  fatbinary.Rule._M_dataplus._M_p._0_4_ = 0x3f800000;
  fatbinary.Rule._M_string_length = 0;
  fatbinary.Rule.field_2._M_allocated_capacity = 0;
  TargetLinkLanguage(&dcompile.Comment,this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&dcompile.Comment,
             config,true);
  std::__cxx11::string::~string((string *)&dcompile);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&dcompile,&this->super_cmNinjaTargetGenerator,config);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&fatbinary,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
               _vptr_cmLinkLineComputer,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
               DirectoryState.Tree);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&fatbinary,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dcompile.Comment._M_dataplus._M_p,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dcompile.Comment._M_string_length);
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )fatbinary.Comment.field_2._M_allocated_capacity,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )0x0,&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dcompile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&fatbinary);
  local_440 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&fatbinary.Comment,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(local_440->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d]
  )(&dcompile,local_440,config);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (&objectDir,&fatbinary.Comment,&dcompile.Comment);
  std::__cxx11::string::~string((string *)&dcompile);
  std::__cxx11::string::~string((string *)&fatbinary);
  psVar3 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,&objectDir);
  std::__cxx11::string::string((string *)&ninjaOutputDir,(string *)psVar3);
  local_418 = this;
  LanguageLinkerCudaFatbinaryRule(&local_190,this,config);
  cmNinjaBuild::cmNinjaBuild(&fatbinary,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  pbVar1 = (architectures->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (architectures->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::find((char)pbVar6,0x2d);
    std::__cxx11::string::substr((ulong)&linkLineComputer,(ulong)pbVar6);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[5],std::__cxx11::string_const&,char_const(&)[7]>
              (&frameworkPath,&ninjaOutputDir,(char (*) [5])"/sm_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &linkLineComputer,(char (*) [7])".cubin");
    LanguageLinkerCudaDeviceRule(&local_50,local_418,config);
    cmNinjaBuild::cmNinjaBuild(&dcompile,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&dcompile.ExplicitDeps,&explicitDeps);
    std::__cxx11::string::string((string *)&linkPath,(string *)&frameworkPath);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &dcompile.Outputs,&linkPath,&local_418);
    std::__cxx11::string::~string((string *)&linkPath);
    cmStrCat<char_const(&)[4],std::__cxx11::string_const&>
              (&linkPath,(char (*) [4])0x7c4c11,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &linkLineComputer);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkLibs,"ARCH",(allocator<char> *)&local_348);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&dcompile.Variables,&linkLibs);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkPath);
    std::__cxx11::string::~string((string *)&linkLibs);
    std::__cxx11::string::~string((string *)&linkPath);
    if (fatbinary.ExplicitDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        fatbinary.ExplicitDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[23]>
                (&linkPath,(char (*) [26])0x7e34c6,&ninjaOutputDir,
                 (char (*) [23])"/cmake_cuda_register.h");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkLibs,"REGISTER",(allocator<char> *)&local_348);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&dcompile.Variables,&linkLibs);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkPath);
      std::__cxx11::string::~string((string *)&linkLibs);
      std::__cxx11::string::~string((string *)&linkPath);
    }
    cmStrCat<char_const(&)[17],std::__cxx11::string_const&,char_const(&)[7],std::__cxx11::string_const&>
              (&linkPath,(char (*) [17])" -im=profile=sm_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &linkLineComputer,(char (*) [7])",file=",&frameworkPath);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkLibs,"PROFILES",(allocator<char> *)&local_348);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fatbinary.Variables,&linkLibs);
    std::__cxx11::string::append((string *)pmVar4);
    std::__cxx11::string::~string((string *)&linkLibs);
    std::__cxx11::string::~string((string *)&linkPath);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &fatbinary.ExplicitDeps,&frameworkPath);
    pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&local_418->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild(local_440,(ostream *)pcVar5,&dcompile,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild(&dcompile);
    std::__cxx11::string::~string((string *)&frameworkPath);
    std::__cxx11::string::~string((string *)&linkLineComputer);
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (&dcompile.Comment,&ninjaOutputDir,(char (*) [21])"/cmake_cuda_fatbin.h");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fatbinary.Outputs
             ,&dcompile,&dcompile.Rule);
  this_02 = local_418;
  std::__cxx11::string::~string((string *)&dcompile);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this_02->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(local_440,(ostream *)pcVar5,&fatbinary,0,(bool *)0x0);
  this_01 = (this_02->super_cmNinjaTargetGenerator).LocalGenerator;
  LanguageLinkerCudaDeviceCompileRule(&local_1b0,this_02,config);
  cmNinjaBuild::cmNinjaBuild(&dcompile,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&linkLineComputer,(string *)output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dcompile.Outputs,
             &linkLineComputer,
             &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              Snapshot_.Position);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            ((string *)&linkLineComputer,&ninjaOutputDir,(char (*) [21])"/cmake_cuda_fatbin.h");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &dcompile.ExplicitDeps,&linkLineComputer,
             &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              Snapshot_.Position);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (&frameworkPath,&objectDir,(char (*) [21])"/cmake_cuda_fatbin.h");
  source._M_str = frameworkPath._M_dataplus._M_p;
  source._M_len = frameworkPath._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&linkLineComputer,(cmOutputConverter *)this_01,source,SHELL,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkPath,"FATBIN",(allocator<char> *)&linkLibs);
  this_00 = &dcompile.Variables;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&linkPath);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
            (&frameworkPath,&objectDir,(char (*) [23])"/cmake_cuda_register.h");
  source_00._M_str = frameworkPath._M_dataplus._M_p;
  source_00._M_len = frameworkPath._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&linkLineComputer,(cmOutputConverter *)this_01,source_00,SHELL,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkPath,"REGISTER",(allocator<char> *)&linkLibs);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&linkPath);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkPath,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frameworkPath,(cmStateSnapshot *)&linkPath);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,(cmOutputConverter *)this_01,(cmStateDirectory *)&frameworkPath,
             local_440);
  iVar2 = (*(local_440->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar2,0));
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"LINK_FLAGS",&local_441);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_348);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)this_01,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             &linkLibs,pmVar4,&frameworkPath,&linkPath,
             (this_02->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_348);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this_02->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(local_440,(ostream *)pcVar5,&dcompile,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&linkLibs);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  cmNinjaBuild::~cmNinjaBuild(&dcompile);
  cmNinjaBuild::~cmNinjaBuild(&fatbinary);
  std::__cxx11::string::~string((string *)&ninjaOutputDir);
  std::__cxx11::string::~string((string *)&objectDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements(
  const std::string& config, const std::vector<std::string>& architectures,
  const std::string& output)
{
  // Ensure there are no duplicates.
  const cmNinjaDeps explicitDeps = [&]() -> std::vector<std::string> {
    std::unordered_set<std::string> depsSet;
    const cmNinjaDeps linkDeps =
      this->ComputeLinkDeps(this->TargetLinkLanguage(config), config, true);
    const cmNinjaDeps objects = this->GetObjects(config);
    depsSet.insert(linkDeps.begin(), linkDeps.end());
    depsSet.insert(objects.begin(), objects.end());

    std::vector<std::string> deps;
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  cmGlobalNinjaGenerator* globalGen{ this->GetGlobalGenerator() };
  const std::string objectDir =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));
  const std::string ninjaOutputDir = this->ConvertToNinjaPath(objectDir);

  cmNinjaBuild fatbinary(this->LanguageLinkerCudaFatbinaryRule(config));

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(ninjaOutputDir, "/sm_", architecture, ".cubin");

    cmNinjaBuild dlink(this->LanguageLinkerCudaDeviceRule(config));
    dlink.ExplicitDeps = explicitDeps;
    dlink.Outputs = { cubin };
    dlink.Variables["ARCH"] = cmStrCat("sm_", architecture);

    // The generated register file contains macros that when expanded register
    // the device routines. Because the routines are the same for all
    // architectures the register file will be the same too. Thus generate it
    // only on the first invocation to reduce overhead.
    if (fatbinary.ExplicitDeps.empty()) {
      dlink.Variables["REGISTER"] = cmStrCat(
        "--register-link-binaries=", ninjaOutputDir, "/cmake_cuda_register.h");
    }

    fatbinary.Variables["PROFILES"] +=
      cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinary.ExplicitDeps.emplace_back(cubin);

    globalGen->WriteBuild(this->GetCommonFileStream(), dlink);
  }

  // Combine all architectures into a single fatbinary.
  fatbinary.Outputs = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  globalGen->WriteBuild(this->GetCommonFileStream(), fatbinary);

  // Compile the stub that registers the kernels and contains the fatbinaries.
  cmLocalNinjaGenerator* localGen{ this->GetLocalGenerator() };
  cmNinjaBuild dcompile(this->LanguageLinkerCudaDeviceCompileRule(config));
  dcompile.Outputs = { output };
  dcompile.ExplicitDeps = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  dcompile.Variables["FATBIN"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_fatbin.h"), cmOutputConverter::SHELL);
  dcompile.Variables["REGISTER"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_register.h"), cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    localGen, localGen->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  // Link libraries and paths are only used during the final executable/library
  // link.
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  localGen->GetDeviceLinkFlags(linkLineComputer, config, linkLibs,
                               dcompile.Variables["LINK_FLAGS"], frameworkPath,
                               linkPath, this->GetGeneratorTarget());

  globalGen->WriteBuild(this->GetCommonFileStream(), dcompile);
}